

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong uVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  U32 local_844;
  U32 local_840;
  U32 local_83c;
  BYTE *local_830;
  BYTE *local_820;
  uint local_810;
  uint local_808;
  BYTE *local_800;
  BYTE *local_7f8;
  BYTE *local_740;
  BYTE *local_730;
  BYTE *local_690;
  BYTE *local_680;
  BYTE *local_5f0;
  BYTE *local_5e0;
  uint local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  uint local_590;
  uint local_58c;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t ofbCandidate_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  int local_4e0;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t ofbCandidate;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  int local_490;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t step;
  size_t ml2;
  size_t offbaseFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_450;
  U32 repIndex;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  ZSTD_matchState_t *pZStack_400;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  undefined4 local_3f0;
  int isDxS;
  int isDDS;
  int isDMS;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  BYTE *prefixLowest;
  BYTE *pBStack_3c0;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  int local_388;
  int local_384;
  size_t local_380;
  void *local_378;
  U32 *local_370;
  seqStore_t *local_368;
  ZSTD_matchState_t *local_360;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  uint local_304;
  uint local_300;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  uint local_2d4;
  U32 local_2d0;
  U32 local_2cc;
  BYTE *local_2c8;
  ZSTD_matchState_t *local_2c0;
  U64 local_2b8;
  U32 local_2b0;
  uint local_2ac;
  BYTE *local_2a8;
  size_t local_2a0;
  U32 local_278;
  uint local_274;
  BYTE *local_270;
  BYTE *local_268;
  int local_248;
  int local_244;
  U32 local_240;
  U32 local_23c;
  size_t *local_238;
  BYTE *local_230;
  BYTE *local_228;
  ZSTD_matchState_t *local_220;
  ulong local_218;
  int local_210;
  int local_20c;
  U32 local_208;
  U32 local_204;
  size_t *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  ZSTD_matchState_t *local_1e8;
  size_t local_1e0;
  int local_1d8;
  int local_1d4;
  U32 local_1d0;
  U32 local_1cc;
  size_t *local_1c8;
  BYTE *local_1c0;
  BYTE *local_1b8;
  ZSTD_matchState_t *local_1b0;
  ulong local_1a8;
  BYTE *local_1a0;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  U32 local_17c;
  BYTE *local_178;
  BYTE *local_170;
  ulong local_168;
  seqStore_t *local_160;
  BYTE *local_158;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  U32 local_134;
  BYTE *local_130;
  BYTE *local_128;
  ulong local_120;
  seqStore_t *local_118;
  BYTE *local_110;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  U32 local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  ulong local_d8;
  seqStore_t *local_d0;
  BYTE *local_c8;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  long local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  pBStack_3c0 = (ms->window).base;
  prefixLowest._4_4_ = (ms->window).dictLimit;
  _rowLog = pBStack_3c0 + prefixLowest._4_4_;
  if ((ms->cParams).minMatch < 6) {
    local_58c = (ms->cParams).minMatch;
  }
  else {
    local_58c = 6;
  }
  if (local_58c < 4) {
    local_590 = 4;
  }
  else {
    if ((ms->cParams).minMatch < 6) {
      local_594 = (ms->cParams).minMatch;
    }
    else {
      local_594 = 6;
    }
    local_590 = local_594;
  }
  if ((ms->cParams).searchLog < 6) {
    local_598 = (ms->cParams).searchLog;
  }
  else {
    local_598 = 6;
  }
  if (local_598 < 4) {
    local_59c = 4;
  }
  else {
    if ((ms->cParams).searchLog < 6) {
      local_5a0 = (ms->cParams).searchLog;
    }
    else {
      local_5a0 = 6;
    }
    local_59c = local_5a0;
  }
  offsetSaved1 = *rep;
  offsetSaved2 = rep[1];
  pZStack_400 = ms->dictMatchState;
  dictBase._4_4_ = (pZStack_400->window).dictLimit;
  dictLowest = (pZStack_400->window).base;
  dictEnd = dictLowest + dictBase._4_4_;
  _dictAndPrefixLength = (pZStack_400->window).nextSrc;
  curr = prefixLowest._4_4_ - ((int)_dictAndPrefixLength - (int)dictLowest);
  windowLow = ((int)src - (int)_rowLog) + ((int)_dictAndPrefixLength - (int)dictEnd);
  anchor = (BYTE *)((long)src + (long)(int)(uint)(windowLow == 0));
  local_384 = 1;
  local_388 = 2;
  istart._4_4_ = 2;
  offset_1 = local_590;
  offset_2 = local_59c;
  isDMS = 0;
  isDDS = 0;
  isDxS = 1;
  local_3f0 = 0;
  dms._4_4_ = 1;
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_380 = srcSize;
  local_378 = src;
  local_370 = rep;
  local_368 = seqStore;
  local_360 = ms;
  if (windowLow < offsetSaved1) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (windowLow < offsetSaved2) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->lazySkipping = 0;
  local_384 = 1;
  local_388 = 2;
  istart._4_4_ = 2;
  isDMS = 0;
  isDDS = 0;
  isDxS = 1;
  local_3f0 = 0;
  dms._4_4_ = 1;
  do {
    while( true ) {
      if (base <= anchor) {
        if ((isDMS == 0) || (offsetSaved1 == 0)) {
          local_83c = isDDS;
        }
        else {
          local_83c = isDMS;
        }
        if (offsetSaved1 == 0) {
          local_840 = isDMS;
        }
        else {
          local_840 = offsetSaved1;
        }
        *local_370 = local_840;
        if (offsetSaved2 == 0) {
          local_844 = local_83c;
        }
        else {
          local_844 = offsetSaved2;
        }
        local_370[1] = local_844;
        return (long)ilimit - (long)iend;
      }
      offBase = 0;
      start = (BYTE *)0x1;
      pBStack_450 = anchor + 1;
      if (dms._4_4_ == 0) break;
      repMatch._4_4_ = (((int)anchor - (int)pBStack_3c0) + 1) - offsetSaved1;
      if (((istart._4_4_ == 2) || (istart._4_4_ == 3)) && (repMatch._4_4_ < prefixLowest._4_4_)) {
        local_5e0 = dictLowest + (repMatch._4_4_ - curr);
      }
      else {
        local_5e0 = pBStack_3c0 + repMatch._4_4_;
      }
      repMatchEnd = local_5e0;
      if ((prefixLowest._4_4_ - 1) - repMatch._4_4_ < 3) break;
      UVar2 = MEM_read32(local_5e0);
      UVar3 = MEM_read32(anchor + 1);
      if (UVar2 != UVar3) break;
      if (repMatch._4_4_ < prefixLowest._4_4_) {
        local_5f0 = _dictAndPrefixLength;
      }
      else {
        local_5f0 = ilimit;
      }
      offbaseFound = (size_t)local_5f0;
      sVar7 = ZSTD_count_2segments(anchor + 5,repMatchEnd + 4,ilimit,local_5f0,_rowLog);
      offBase = sVar7 + 4;
      if (local_388 != 0) break;
LAB_002bb7c1:
      local_d8 = (long)pBStack_450 - (long)iend;
      local_d0 = local_368;
      local_e0 = iend;
      local_e8 = ilimit;
      local_ec = (U32)start;
      litLimit_w = (BYTE *)offBase;
      litEnd = ilimit + -0x20;
      mlBase = (size_t)(iend + local_d8);
      if (local_368->maxNbSeq <=
          (ulong)((long)local_368->sequences - (long)local_368->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_368->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_368->litStart + local_368->maxNbLit < local_368->lit + local_d8) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit < iend + local_d8) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (litEnd < mlBase) {
        ZSTD_safecopyLiterals(local_368->lit,iend,(BYTE *)mlBase,litEnd);
      }
      else {
        ZSTD_copy16(local_368->lit,iend);
        if (0x10 < local_d8) {
          oend = local_d0->lit + 0x10;
          op = local_e0 + 0x10;
          local_a0 = local_d8 - 0x10;
          diff._4_4_ = 0;
          ip_1 = oend + -(long)op;
          local_c8 = oend + local_a0;
          local_98 = op;
          local_90 = oend;
          if (((long)ip_1 < 0x10) && (-0x10 < (long)ip_1)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend,op);
          if (0x10 < local_a0) {
            oend = oend + 0x10;
            op = op + 0x10;
            do {
              ZSTD_copy16(oend,op);
              oend = oend + 0x10;
              op = op + 0x10;
              ZSTD_copy16(oend,op);
              oend = oend + 0x10;
              op = op + 0x10;
            } while (oend < local_c8);
          }
        }
      }
      local_d0->lit = local_d0->lit + local_d8;
      if (0xffff < local_d8) {
        if (local_d0->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthType = ZSTD_llt_literalLength;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->litLength = (U16)local_d8;
      local_d0->sequences->offBase = local_ec;
      if (litLimit_w < (BYTE *)0x3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_110 = litLimit_w + -3;
      if ((BYTE *)0xffff < local_110) {
        if (local_d0->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthType = ZSTD_llt_matchLength;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->mlBase = (U16)local_110;
      local_d0->sequences = local_d0->sequences + 1;
      iend = pBStack_450 + offBase;
      anchor = iend;
      if (local_360->lazySkipping != 0) {
        if (local_384 == 2) {
          local_2d4 = local_360->nextToUpdate;
          local_2c0 = local_360;
          local_2c8 = pBStack_3c0;
          local_2cc = offset_2;
          local_2d0 = offset_1;
          hashTable_1 = (U32 *)base;
          tagTable_1 = (BYTE *)local_360->hashTable;
          _maxElemsToPrefetch_1 = local_360->tagTable;
          lim_1 = local_360->rowHashLog;
          if (base < pBStack_3c0 + local_2d4) {
            local_808 = 0;
          }
          else {
            local_808 = ((int)base - ((int)pBStack_3c0 + local_2d4)) + 1;
          }
          hash_1 = local_808;
          if (local_808 < 9) {
            local_810 = local_808;
          }
          else {
            local_810 = 8;
          }
          row_1 = local_2d4 + local_810;
          for (; local_2d4 < row_1; local_2d4 = local_2d4 + 1) {
            local_2a8 = local_2c8 + local_2d4;
            local_2ac = lim_1 + 8;
            local_2b8 = local_2c0->hashSalt;
            local_2b0 = local_2d0;
            if (0x20 < local_2ac) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
            }
            switch(local_2d0) {
            default:
              local_2a0 = ZSTD_hash4PtrS(local_2a8,local_2ac,(U32)local_2b8);
              break;
            case 5:
              local_2a0 = ZSTD_hash5PtrS(local_2a8,local_2ac,local_2b8);
              break;
            case 6:
              local_2a0 = ZSTD_hash6PtrS(local_2a8,local_2ac,local_2b8);
              break;
            case 7:
              local_2a0 = ZSTD_hash7PtrS(local_2a8,local_2ac,local_2b8);
              break;
            case 8:
              local_2a0 = ZSTD_hash8PtrS(local_2a8,local_2ac,local_2b8);
            }
            local_300 = (uint)local_2a0;
            local_304 = (local_300 >> 8) << ((byte)local_2cc & 0x1f);
            local_268 = tagTable_1;
            local_270 = _maxElemsToPrefetch_1;
            local_278 = local_2cc;
            local_274 = local_304;
            if (((local_2cc != 4) && (local_2cc != 5)) && (local_2cc != 6)) {
              __assert_fail("rowLog == 4 || rowLog == 5 || rowLog == 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x32d,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            iVar5 = ZSTD_isAligned(tagTable_1 + (ulong)local_304 * 4,0x40);
            if (iVar5 == 0) {
              __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x32e,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            iVar5 = ZSTD_isAligned(local_270 + local_274,1L << ((byte)local_278 & 0x3f));
            if (iVar5 == 0) {
              __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x32f,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            local_2c0->hashCache[local_2d4 & 7] = local_300;
          }
        }
        local_360->lazySkipping = 0;
      }
      if (dms._4_4_ != 0) {
        while (anchor <= base) {
          uVar6 = ((int)anchor - (int)pBStack_3c0) - offsetSaved2;
          if (uVar6 < prefixLowest._4_4_) {
            local_820 = dictLowest + ((ulong)uVar6 - (ulong)curr);
          }
          else {
            local_820 = pBStack_3c0 + uVar6;
          }
          if ((prefixLowest._4_4_ - 1) - uVar6 < 3) break;
          UVar2 = MEM_read32(local_820);
          UVar3 = MEM_read32(anchor);
          if (UVar2 != UVar3) break;
          if (uVar6 < prefixLowest._4_4_) {
            local_830 = _dictAndPrefixLength;
          }
          else {
            local_830 = ilimit;
          }
          sVar7 = ZSTD_count_2segments(anchor + 4,local_820 + 4,ilimit,local_830,_rowLog);
          UVar2 = offsetSaved2;
          offBase = sVar7 + 4;
          start = (BYTE *)(ulong)offsetSaved2;
          offsetSaved2 = offsetSaved1;
          offsetSaved1 = UVar2;
          local_160 = local_368;
          local_168 = 0;
          local_170 = iend;
          local_178 = ilimit;
          local_17c = 1;
          litEnd_1 = ilimit + -0x20;
          mlBase_1 = (size_t)iend;
          litLimit_w_1 = (BYTE *)offBase;
          if (local_368->maxNbSeq <=
              (ulong)((long)local_368->sequences - (long)local_368->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < local_368->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_368->litStart + local_368->maxNbLit < local_368->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit < iend) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (litEnd_1 < iend) {
            ZSTD_safecopyLiterals(local_368->lit,iend,iend,litEnd_1);
          }
          else {
            ZSTD_copy16(local_368->lit,iend);
            if (0x10 < local_168) {
              oend_1 = local_160->lit + 0x10;
              op_1 = local_170 + 0x10;
              local_20 = local_168 - 0x10;
              diff_1._4_4_ = 0;
              ip_2 = oend_1 + -(long)op_1;
              local_48 = oend_1 + local_20;
              local_18 = op_1;
              local_10 = oend_1;
              if (((long)ip_2 < 0x10) && (-0x10 < (long)ip_2)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(oend_1,op_1);
              if (0x10 < local_20) {
                oend_1 = oend_1 + 0x10;
                op_1 = op_1 + 0x10;
                do {
                  ZSTD_copy16(oend_1,op_1);
                  oend_1 = oend_1 + 0x10;
                  op_1 = op_1 + 0x10;
                  ZSTD_copy16(oend_1,op_1);
                  oend_1 = oend_1 + 0x10;
                  op_1 = op_1 + 0x10;
                } while (oend_1 < local_48);
              }
            }
          }
          local_160->lit = local_160->lit + local_168;
          if (0xffff < local_168) {
            if (local_160->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_160->longLengthType = ZSTD_llt_literalLength;
            local_160->longLengthPos =
                 (U32)((long)local_160->sequences - (long)local_160->sequencesStart >> 3);
          }
          local_160->sequences->litLength = (U16)local_168;
          local_160->sequences->offBase = local_17c;
          if (litLimit_w_1 < (BYTE *)0x3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_1a0 = litLimit_w_1 + -3;
          if ((BYTE *)0xffff < local_1a0) {
            if (local_160->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_160->longLengthType = ZSTD_llt_matchLength;
            local_160->longLengthPos =
                 (U32)((long)local_160->sequences - (long)local_160->sequencesStart >> 3);
          }
          local_160->sequences->mlBase = (U16)local_1a0;
          local_160->sequences = local_160->sequences + 1;
          iend = anchor + offBase;
          anchor = iend;
        }
      }
      if (istart._4_4_ == 0) {
        while( true ) {
          bVar10 = false;
          if (anchor <= base && offsetSaved2 != 0) {
            UVar2 = MEM_read32(anchor);
            UVar3 = MEM_read32(anchor + -(ulong)offsetSaved2);
            bVar10 = UVar2 == UVar3;
          }
          if (!bVar10) break;
          sVar7 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)offsetSaved2),ilimit);
          UVar2 = offsetSaved2;
          offBase = sVar7 + 4;
          start = (BYTE *)(ulong)offsetSaved2;
          offsetSaved2 = offsetSaved1;
          offsetSaved1 = UVar2;
          local_118 = local_368;
          local_120 = 0;
          local_128 = iend;
          local_130 = ilimit;
          local_134 = 1;
          litEnd_2 = ilimit + -0x20;
          mlBase_2 = (size_t)iend;
          litLimit_w_2 = (BYTE *)offBase;
          if (local_368->maxNbSeq <=
              (ulong)((long)local_368->sequences - (long)local_368->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < local_368->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_368->litStart + local_368->maxNbLit < local_368->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit < iend) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (litEnd_2 < iend) {
            ZSTD_safecopyLiterals(local_368->lit,iend,iend,litEnd_2);
          }
          else {
            ZSTD_copy16(local_368->lit,iend);
            if (0x10 < local_120) {
              oend_2 = local_118->lit + 0x10;
              op_2 = local_128 + 0x10;
              local_60 = local_120 - 0x10;
              diff_2._4_4_ = 0;
              ip_3 = oend_2 + -(long)op_2;
              local_88 = oend_2 + local_60;
              local_58 = op_2;
              local_50 = oend_2;
              if (((long)ip_3 < 0x10) && (-0x10 < (long)ip_3)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(oend_2,op_2);
              if (0x10 < local_60) {
                oend_2 = oend_2 + 0x10;
                op_2 = op_2 + 0x10;
                do {
                  ZSTD_copy16(oend_2,op_2);
                  oend_2 = oend_2 + 0x10;
                  op_2 = op_2 + 0x10;
                  ZSTD_copy16(oend_2,op_2);
                  oend_2 = oend_2 + 0x10;
                  op_2 = op_2 + 0x10;
                } while (oend_2 < local_88);
              }
            }
          }
          local_118->lit = local_118->lit + local_120;
          if (0xffff < local_120) {
            if (local_118->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_118->longLengthType = ZSTD_llt_literalLength;
            local_118->longLengthPos =
                 (U32)((long)local_118->sequences - (long)local_118->sequencesStart >> 3);
          }
          local_118->sequences->litLength = (U16)local_120;
          local_118->sequences->offBase = local_134;
          if (litLimit_w_2 < (BYTE *)0x3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_158 = litLimit_w_2 + -3;
          if ((BYTE *)0xffff < local_158) {
            if (local_118->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_118->longLengthType = ZSTD_llt_matchLength;
            local_118->longLengthPos =
                 (U32)((long)local_118->sequences - (long)local_118->sequencesStart >> 3);
          }
          local_118->sequences->mlBase = (U16)local_158;
          local_118->sequences = local_118->sequences + 1;
          iend = anchor + offBase;
          anchor = iend;
        }
      }
    }
    if (istart._4_4_ == 0) {
      bVar10 = offsetSaved1 != 0;
      UVar2 = MEM_read32(anchor + (1 - (ulong)offsetSaved1));
      UVar3 = MEM_read32(anchor + 1);
      if (bVar10 && UVar2 == UVar3) {
        sVar7 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)offsetSaved1),ilimit);
        offBase = sVar7 + 4;
        if (local_388 == 0) goto LAB_002bb7c1;
      }
    }
    ml2 = 999999999;
    local_1b0 = local_360;
    local_1b8 = anchor;
    local_1c0 = ilimit;
    local_1c8 = &ml2;
    local_1cc = offset_1;
    local_1d0 = offset_2;
    local_1d4 = local_384;
    local_1d8 = istart._4_4_;
    if (istart._4_4_ == 0) {
      if (local_384 == 0) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_HcFindBestMatch_noDict_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_HcFindBestMatch_noDict_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b77fc;
          local_1a8 = ZSTD_HcFindBestMatch_noDict_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else if (local_384 == 1) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_BtFindBestMatch_noDict_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_BtFindBestMatch_noDict_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b77fc;
          local_1a8 = ZSTD_BtFindBestMatch_noDict_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else {
        if (local_384 != 2) {
LAB_002b77fc:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x5c4,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (offset_1 == 4) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_4_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_4_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c4,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_noDict_4_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else if (offset_1 == 5) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_5_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_5_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c4,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_noDict_5_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else {
          if (offset_1 != 6) goto LAB_002b77fc;
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_6_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_noDict_6_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c4,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_noDict_6_6(local_360,anchor,ilimit,local_1c8);
          }
        }
      }
    }
    else if (istart._4_4_ == 1) {
      if (local_384 == 0) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_HcFindBestMatch_extDict_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_HcFindBestMatch_extDict_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b7c93;
          local_1a8 = ZSTD_HcFindBestMatch_extDict_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else if (local_384 == 1) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_BtFindBestMatch_extDict_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_BtFindBestMatch_extDict_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b7c93;
          local_1a8 = ZSTD_BtFindBestMatch_extDict_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else {
        if (local_384 != 2) {
LAB_002b7c93:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x5c6,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (offset_1 == 4) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_4_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_4_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_extDict_4_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else if (offset_1 == 5) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_5_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_5_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_extDict_5_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else {
          if (offset_1 != 6) goto LAB_002b7c93;
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_6_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_extDict_6_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_extDict_6_6(local_360,anchor,ilimit,local_1c8);
          }
        }
      }
    }
    else if (istart._4_4_ == 2) {
      if (local_384 == 0) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_HcFindBestMatch_dictMatchState_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_HcFindBestMatch_dictMatchState_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b812a;
          local_1a8 = ZSTD_HcFindBestMatch_dictMatchState_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else if (local_384 == 1) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_BtFindBestMatch_dictMatchState_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_BtFindBestMatch_dictMatchState_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b812a;
          local_1a8 = ZSTD_BtFindBestMatch_dictMatchState_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else {
        if (local_384 != 2) {
LAB_002b812a:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x5c8,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (offset_1 == 4) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_4_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_4_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c8,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_4_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else if (offset_1 == 5) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_5_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_5_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c8,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_5_6(local_360,anchor,ilimit,local_1c8);
          }
        }
        else {
          if (offset_1 != 6) goto LAB_002b812a;
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_6_4(local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_6_5(local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c8,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dictMatchState_6_6(local_360,anchor,ilimit,local_1c8);
          }
        }
      }
    }
    else {
      if (istart._4_4_ != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x5cc,
                      "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                     );
      }
      if (local_384 == 0) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b85be;
          local_1a8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else if (local_384 == 1) {
        if (offset_1 == 4) {
          local_1a8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4(local_360,anchor,ilimit,local_1c8);
        }
        else if (offset_1 == 5) {
          local_1a8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5(local_360,anchor,ilimit,local_1c8);
        }
        else {
          if (offset_1 != 6) goto LAB_002b85be;
          local_1a8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6(local_360,anchor,ilimit,local_1c8);
        }
      }
      else {
        if (local_384 != 2) {
LAB_002b85be:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x5ca,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (offset_1 == 4) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5ca,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                  (local_360,anchor,ilimit,local_1c8);
          }
        }
        else if (offset_1 == 5) {
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5ca,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                  (local_360,anchor,ilimit,local_1c8);
          }
        }
        else {
          if (offset_1 != 6) goto LAB_002b85be;
          if (offset_2 == 4) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else if (offset_2 == 5) {
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                  (local_360,anchor,ilimit,local_1c8);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5ca,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_1a8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                  (local_360,anchor,ilimit,local_1c8);
          }
        }
      }
    }
    step = local_1a8;
    if (offBase < local_1a8) {
      offBase = local_1a8;
      pBStack_450 = anchor;
      start = (BYTE *)ml2;
    }
    if (3 < offBase) {
      if (local_388 != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
            bVar10 = offsetSaved1 != 0;
            UVar2 = MEM_read32(anchor);
            UVar3 = MEM_read32(anchor + -(ulong)offsetSaved1);
            if (bVar10 && UVar2 == UVar3) {
              sVar7 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)offsetSaved1),ilimit);
              _gain1 = sVar7 + 4;
              repIndex_1 = (int)_gain1 * 3;
              iVar5 = (int)offBase;
              uVar6 = ZSTD_highbit32((U32)start);
              local_490 = (iVar5 * 3 - uVar6) + 1;
              if ((3 < _gain1) && (local_490 < (int)repIndex_1)) {
                offBase = _gain1;
                start = (BYTE *)0x1;
                pBStack_450 = anchor;
              }
            }
          }
          if (dms._4_4_ != 0) {
            repMatch_1._4_4_ = ((int)anchor - (int)pBStack_3c0) - offsetSaved1;
            if (repMatch_1._4_4_ < prefixLowest._4_4_) {
              local_680 = dictLowest + (repMatch_1._4_4_ - curr);
            }
            else {
              local_680 = pBStack_3c0 + repMatch_1._4_4_;
            }
            repMatchEnd_1 = local_680;
            if (2 < (prefixLowest._4_4_ - 1) - repMatch_1._4_4_) {
              UVar2 = MEM_read32(local_680);
              UVar3 = MEM_read32(anchor);
              if (UVar2 == UVar3) {
                if (repMatch_1._4_4_ < prefixLowest._4_4_) {
                  local_690 = _dictAndPrefixLength;
                }
                else {
                  local_690 = ilimit;
                }
                mlRep_1 = (size_t)local_690;
                sVar7 = ZSTD_count_2segments(anchor + 4,repMatchEnd_1 + 4,ilimit,local_690,_rowLog);
                _gain1_1 = sVar7 + 4;
                ofbCandidate._4_4_ = (int)_gain1_1 * 3;
                iVar5 = (int)offBase;
                uVar6 = ZSTD_highbit32((U32)start);
                ofbCandidate._0_4_ = (iVar5 * 3 - uVar6) + 1;
                if ((3 < _gain1_1) && ((int)ofbCandidate < ofbCandidate._4_4_)) {
                  offBase = _gain1_1;
                  start = (BYTE *)0x1;
                  pBStack_450 = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          local_1e8 = local_360;
          local_1f0 = anchor;
          local_1f8 = ilimit;
          local_200 = &ml2_1;
          local_204 = offset_1;
          local_208 = offset_2;
          local_20c = local_384;
          local_210 = istart._4_4_;
          if (istart._4_4_ == 0) {
            if (local_384 == 0) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_HcFindBestMatch_noDict_4(local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_HcFindBestMatch_noDict_5(local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b8ec7;
                local_1e0 = ZSTD_HcFindBestMatch_noDict_6(local_360,anchor,ilimit,local_200);
              }
            }
            else if (local_384 == 1) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_BtFindBestMatch_noDict_4(local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_BtFindBestMatch_noDict_5(local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b8ec7;
                local_1e0 = ZSTD_BtFindBestMatch_noDict_6(local_360,anchor,ilimit,local_200);
              }
            }
            else {
              if (local_384 != 2) {
LAB_002b8ec7:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5c4,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (offset_1 == 4) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_4_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_4_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c4,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_4_6(local_360,anchor,ilimit,local_200);
                }
              }
              else if (offset_1 == 5) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_5_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_5_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c4,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_5_6(local_360,anchor,ilimit,local_200);
                }
              }
              else {
                if (offset_1 != 6) goto LAB_002b8ec7;
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_6_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_6_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c4,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_noDict_6_6(local_360,anchor,ilimit,local_200);
                }
              }
            }
          }
          else if (istart._4_4_ == 1) {
            if (local_384 == 0) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_HcFindBestMatch_extDict_4(local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_HcFindBestMatch_extDict_5(local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b935e;
                local_1e0 = ZSTD_HcFindBestMatch_extDict_6(local_360,anchor,ilimit,local_200);
              }
            }
            else if (local_384 == 1) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_BtFindBestMatch_extDict_4(local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_BtFindBestMatch_extDict_5(local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b935e;
                local_1e0 = ZSTD_BtFindBestMatch_extDict_6(local_360,anchor,ilimit,local_200);
              }
            }
            else {
              if (local_384 != 2) {
LAB_002b935e:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5c6,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (offset_1 == 4) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_4_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_4_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_4_6(local_360,anchor,ilimit,local_200);
                }
              }
              else if (offset_1 == 5) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_5_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_5_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_5_6(local_360,anchor,ilimit,local_200);
                }
              }
              else {
                if (offset_1 != 6) goto LAB_002b935e;
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_6_4(local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_6_5(local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_extDict_6_6(local_360,anchor,ilimit,local_200);
                }
              }
            }
          }
          else if (istart._4_4_ == 2) {
            if (local_384 == 0) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_HcFindBestMatch_dictMatchState_4(local_360,anchor,ilimit,local_200)
                ;
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_HcFindBestMatch_dictMatchState_5(local_360,anchor,ilimit,local_200)
                ;
              }
              else {
                if (offset_1 != 6) goto LAB_002b97f5;
                local_1e0 = ZSTD_HcFindBestMatch_dictMatchState_6(local_360,anchor,ilimit,local_200)
                ;
              }
            }
            else if (local_384 == 1) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_BtFindBestMatch_dictMatchState_4(local_360,anchor,ilimit,local_200)
                ;
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_BtFindBestMatch_dictMatchState_5(local_360,anchor,ilimit,local_200)
                ;
              }
              else {
                if (offset_1 != 6) goto LAB_002b97f5;
                local_1e0 = ZSTD_BtFindBestMatch_dictMatchState_6(local_360,anchor,ilimit,local_200)
                ;
              }
            }
            else {
              if (local_384 != 2) {
LAB_002b97f5:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5c8,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (offset_1 == 4) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c8,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
              else if (offset_1 == 5) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c8,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
              else {
                if (offset_1 != 6) goto LAB_002b97f5;
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c8,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
            }
          }
          else {
            if (istart._4_4_ != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5cc,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            if (local_384 == 0) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                      (local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                      (local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b9c89;
                local_1e0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                      (local_360,anchor,ilimit,local_200);
              }
            }
            else if (local_384 == 1) {
              if (offset_1 == 4) {
                local_1e0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                      (local_360,anchor,ilimit,local_200);
              }
              else if (offset_1 == 5) {
                local_1e0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                      (local_360,anchor,ilimit,local_200);
              }
              else {
                if (offset_1 != 6) goto LAB_002b9c89;
                local_1e0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                      (local_360,anchor,ilimit,local_200);
              }
            }
            else {
              if (local_384 != 2) {
LAB_002b9c89:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5ca,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (offset_1 == 4) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5ca,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
              else if (offset_1 == 5) {
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5ca,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
              else {
                if (offset_1 != 6) goto LAB_002b9c89;
                if (offset_2 == 4) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                        (local_360,anchor,ilimit,local_200);
                }
                else if (offset_2 == 5) {
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                        (local_360,anchor,ilimit,local_200);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5ca,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_1e0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                        (local_360,anchor,ilimit,local_200);
                }
              }
            }
          }
          _gain1_2 = local_1e0;
          lVar8 = local_1e0 << 2;
          uVar6 = ZSTD_highbit32((U32)ml2_1);
          mlRep_2._4_4_ = (int)lVar8 - uVar6;
          lVar8 = offBase << 2;
          uVar6 = ZSTD_highbit32((U32)start);
          mlRep_2._0_4_ = ((int)lVar8 - uVar6) + 4;
          if ((_gain1_2 < 4) || (mlRep_2._4_4_ <= (int)mlRep_2)) {
            if ((local_388 != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
              bVar10 = offsetSaved1 != 0;
              UVar2 = MEM_read32(anchor);
              UVar3 = MEM_read32(anchor + -(ulong)offsetSaved1);
              if (bVar10 && UVar2 == UVar3) {
                sVar7 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)offsetSaved1),ilimit);
                _gain1_3 = sVar7 + 4;
                repIndex_2 = (int)_gain1_3 * 4;
                lVar8 = offBase << 2;
                uVar6 = ZSTD_highbit32((U32)start);
                local_4e0 = ((int)lVar8 - uVar6) + 1;
                if ((3 < _gain1_3) && (local_4e0 < (int)repIndex_2)) {
                  offBase = _gain1_3;
                  start = (BYTE *)0x1;
                  pBStack_450 = anchor;
                }
              }
            }
            if (dms._4_4_ != 0) {
              repMatch_2._4_4_ = ((int)anchor - (int)pBStack_3c0) - offsetSaved1;
              if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                local_730 = dictLowest + (repMatch_2._4_4_ - curr);
              }
              else {
                local_730 = pBStack_3c0 + repMatch_2._4_4_;
              }
              repMatchEnd_2 = local_730;
              if (2 < (prefixLowest._4_4_ - 1) - repMatch_2._4_4_) {
                UVar2 = MEM_read32(local_730);
                UVar3 = MEM_read32(anchor);
                if (UVar2 == UVar3) {
                  if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                    local_740 = _dictAndPrefixLength;
                  }
                  else {
                    local_740 = ilimit;
                  }
                  mlRep_3 = (size_t)local_740;
                  sVar7 = ZSTD_count_2segments
                                    (anchor + 4,repMatchEnd_2 + 4,ilimit,local_740,_rowLog);
                  _gain1_4 = sVar7 + 4;
                  ofbCandidate_1._4_4_ = (int)_gain1_4 * 4;
                  lVar8 = offBase << 2;
                  uVar6 = ZSTD_highbit32((U32)start);
                  ofbCandidate_1._0_4_ = ((int)lVar8 - uVar6) + 1;
                  if ((3 < _gain1_4) && ((int)ofbCandidate_1 < ofbCandidate_1._4_4_)) {
                    offBase = _gain1_4;
                    start = (BYTE *)0x1;
                    pBStack_450 = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            local_220 = local_360;
            local_228 = anchor;
            local_230 = ilimit;
            local_238 = &ml2_2;
            local_23c = offset_1;
            local_240 = offset_2;
            local_244 = local_384;
            local_248 = istart._4_4_;
            if (istart._4_4_ == 0) {
              if (local_384 == 0) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_HcFindBestMatch_noDict_4(local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_HcFindBestMatch_noDict_5(local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002ba5b4;
                  local_218 = ZSTD_HcFindBestMatch_noDict_6(local_360,anchor,ilimit,local_238);
                }
              }
              else if (local_384 == 1) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_BtFindBestMatch_noDict_4(local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_BtFindBestMatch_noDict_5(local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002ba5b4;
                  local_218 = ZSTD_BtFindBestMatch_noDict_6(local_360,anchor,ilimit,local_238);
                }
              }
              else {
                if (local_384 != 2) {
LAB_002ba5b4:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c4,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (offset_1 == 4) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_4_4(local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_4_5(local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c4,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_noDict_4_6(local_360,anchor,ilimit,local_238);
                  }
                }
                else if (offset_1 == 5) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_5_4(local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_5_5(local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c4,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_noDict_5_6(local_360,anchor,ilimit,local_238);
                  }
                }
                else {
                  if (offset_1 != 6) goto LAB_002ba5b4;
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_6_4(local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_noDict_6_5(local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c4,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_noDict_6_6(local_360,anchor,ilimit,local_238);
                  }
                }
              }
            }
            else if (istart._4_4_ == 1) {
              if (local_384 == 0) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_HcFindBestMatch_extDict_4(local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_HcFindBestMatch_extDict_5(local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002baa4b;
                  local_218 = ZSTD_HcFindBestMatch_extDict_6(local_360,anchor,ilimit,local_238);
                }
              }
              else if (local_384 == 1) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_BtFindBestMatch_extDict_4(local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_BtFindBestMatch_extDict_5(local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002baa4b;
                  local_218 = ZSTD_BtFindBestMatch_extDict_6(local_360,anchor,ilimit,local_238);
                }
              }
              else {
                if (local_384 != 2) {
LAB_002baa4b:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c6,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (offset_1 == 4) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_4_4(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_4_5(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c6,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_extDict_4_6(local_360,anchor,ilimit,local_238)
                    ;
                  }
                }
                else if (offset_1 == 5) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_5_4(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_5_5(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c6,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_extDict_5_6(local_360,anchor,ilimit,local_238)
                    ;
                  }
                }
                else {
                  if (offset_1 != 6) goto LAB_002baa4b;
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_6_4(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_extDict_6_5(local_360,anchor,ilimit,local_238)
                    ;
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c6,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_extDict_6_6(local_360,anchor,ilimit,local_238)
                    ;
                  }
                }
              }
            }
            else if (istart._4_4_ == 2) {
              if (local_384 == 0) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_HcFindBestMatch_dictMatchState_4
                                        (local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_HcFindBestMatch_dictMatchState_5
                                        (local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002baee2;
                  local_218 = ZSTD_HcFindBestMatch_dictMatchState_6
                                        (local_360,anchor,ilimit,local_238);
                }
              }
              else if (local_384 == 1) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_BtFindBestMatch_dictMatchState_4
                                        (local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_BtFindBestMatch_dictMatchState_5
                                        (local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002baee2;
                  local_218 = ZSTD_BtFindBestMatch_dictMatchState_6
                                        (local_360,anchor,ilimit,local_238);
                }
              }
              else {
                if (local_384 != 2) {
LAB_002baee2:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c8,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (offset_1 == 4) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c8,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
                else if (offset_1 == 5) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c8,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
                else {
                  if (offset_1 != 6) goto LAB_002baee2;
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5c8,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
              }
            }
            else {
              if (istart._4_4_ != 3) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5cc,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_384 == 0) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                        (local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                        (local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002bb376;
                  local_218 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                        (local_360,anchor,ilimit,local_238);
                }
              }
              else if (local_384 == 1) {
                if (offset_1 == 4) {
                  local_218 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                        (local_360,anchor,ilimit,local_238);
                }
                else if (offset_1 == 5) {
                  local_218 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                        (local_360,anchor,ilimit,local_238);
                }
                else {
                  if (offset_1 != 6) goto LAB_002bb376;
                  local_218 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                        (local_360,anchor,ilimit,local_238);
                }
              }
              else {
                if (local_384 != 2) {
LAB_002bb376:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5ca,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (offset_1 == 4) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5ca,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
                else if (offset_1 == 5) {
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5ca,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
                else {
                  if (offset_1 != 6) goto LAB_002bb376;
                  if (offset_2 == 4) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else if (offset_2 == 5) {
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                          (local_360,anchor,ilimit,local_238);
                  }
                  else {
                    if (offset_2 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                    ,0x5ca,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_218 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                          (local_360,anchor,ilimit,local_238);
                  }
                }
              }
            }
            uVar1 = local_218;
            lVar8 = local_218 << 2;
            uVar6 = ZSTD_highbit32((U32)ml2_2);
            lVar9 = offBase << 2;
            uVar4 = ZSTD_highbit32((U32)start);
            if ((uVar1 < 4) || ((int)((int)lVar8 - uVar6) <= (int)(((int)lVar9 - uVar4) + 7)))
            break;
            offBase = uVar1;
            start = (BYTE *)ml2_2;
            pBStack_450 = anchor;
          }
          else {
            offBase = _gain1_2;
            start = (BYTE *)ml2_1;
            pBStack_450 = anchor;
          }
        }
      }
      if ((BYTE *)0x3 < start) {
        if (istart._4_4_ == 0) {
          while( true ) {
            if (start < (BYTE *)0x4) {
              __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x696,
                            "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                           );
            }
            bVar10 = false;
            if (iend < pBStack_450 && _rowLog < pBStack_450 + -(long)(start + -3)) {
              if (start < (BYTE *)0x4) {
                __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x697,
                              "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                             );
              }
              bVar10 = pBStack_450[-1] == pBStack_450[-1 - (long)(start + -3)];
            }
            if (!bVar10) break;
            pBStack_450 = pBStack_450 + -1;
            offBase = offBase + 1;
          }
        }
        if (dms._4_4_ != 0) {
          if (start < (BYTE *)0x4) {
            __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x69b,
                          "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                         );
          }
          uVar6 = ((int)pBStack_450 - (int)pBStack_3c0) - ((int)start + -3);
          if (uVar6 < prefixLowest._4_4_) {
            local_7f8 = dictLowest + ((ulong)uVar6 - (ulong)curr);
          }
          else {
            local_7f8 = pBStack_3c0 + uVar6;
          }
          mStart = local_7f8;
          if (uVar6 < prefixLowest._4_4_) {
            local_800 = dictEnd;
          }
          else {
            local_800 = _rowLog;
          }
          while( true ) {
            bVar10 = false;
            if ((iend < pBStack_450) && (bVar10 = false, local_800 < mStart)) {
              bVar10 = pBStack_450[-1] == mStart[-1];
            }
            if (!bVar10) break;
            pBStack_450 = pBStack_450 + -1;
            mStart = mStart + -1;
            offBase = offBase + 1;
          }
        }
        offsetSaved2 = offsetSaved1;
        if (start < (BYTE *)0x4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x6a0,
                        "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                       );
        }
        offsetSaved1 = (int)start - 3;
      }
      goto LAB_002bb7c1;
    }
    mlRep = ((ulong)((long)anchor - (long)iend) >> 8) + 1;
    anchor = anchor + mlRep;
    local_360->lazySkipping = (uint)(8 < mlRep);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}